

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O1

void scp::_scp::cooleyTukeyRadix2<std::complex<double>>
               (complex<double> *beg,uint64_t stride,complex<double> *base,uint64_t baseStride,
               uint64_t size)

{
  complex<double> *beg_00;
  double dVar1;
  double dVar2;
  double dVar3;
  ulong size_00;
  complex<double> *x0;
  long lVar4;
  long lVar5;
  complex<double> __r;
  double local_48;
  double dStack_40;
  
  if (size == 2) {
    dVar1 = *(double *)beg->_M_value;
    dVar2 = *(double *)(beg->_M_value + 8);
    local_48 = *(double *)base->_M_value;
    dStack_40 = *(double *)(base->_M_value + 8);
    std::complex<double>::operator*=((complex<double> *)&local_48,beg + stride);
    dVar3 = *(double *)(beg->_M_value + 8);
    *(double *)beg->_M_value = local_48 + *(double *)beg->_M_value;
    *(double *)(beg->_M_value + 8) = dStack_40 + dVar3;
    local_48 = *(double *)base[baseStride]._M_value;
    dStack_40 = *(double *)(base[baseStride]._M_value + 8);
    std::complex<double>::operator*=((complex<double> *)&local_48,beg + stride);
    *(double *)beg[stride]._M_value = dVar1 + local_48;
    *(double *)(beg[stride]._M_value + 8) = dVar2 + dStack_40;
  }
  else {
    size_00 = size >> 1;
    cooleyTukeyRadix2<std::complex<double>>(beg,stride,base,baseStride * 2,size_00);
    lVar4 = size_00 * stride;
    beg_00 = beg + lVar4;
    cooleyTukeyRadix2<std::complex<double>>(beg_00,stride,base,baseStride * 2,size_00);
    if (lVar4 != 0) {
      lVar5 = 0;
      do {
        local_48 = *(double *)base->_M_value;
        dStack_40 = *(double *)(base->_M_value + 8);
        std::complex<double>::operator*=
                  ((complex<double> *)&local_48,(complex<double> *)(beg_00->_M_value + lVar5));
        dVar1 = *(double *)(beg->_M_value + lVar5 + 8);
        *(double *)(beg_00->_M_value + lVar5) = *(double *)(beg->_M_value + lVar5) - local_48;
        *(double *)(beg_00->_M_value + lVar5 + 8) = dVar1 - dStack_40;
        *(double *)(beg->_M_value + lVar5) = local_48 + *(double *)(beg->_M_value + lVar5);
        *(double *)(beg->_M_value + lVar5 + 8) = dStack_40 + *(double *)(beg->_M_value + lVar5 + 8);
        base = base + baseStride;
        lVar5 = lVar5 + stride * 0x10;
      } while (lVar4 * 0x10 != lVar5);
    }
  }
  return;
}

Assistant:

constexpr void cooleyTukeyRadix2(TValue* beg, uint64_t stride, const TValue* base, uint64_t baseStride, uint64_t size)
		{
			if (size == 2)
			{
				TValue& x0 = *beg;
				TValue& x1 = *(beg + stride);
				const TValue tmp = x0;
				x0 += *base * x1;
				x1 = tmp + *(base + baseStride) * x1;
			}
			else
			{
				size >>= 1;
				baseStride <<= 1;

				cooleyTukeyRadix2(beg, stride, base, baseStride, size);
				cooleyTukeyRadix2(beg + size * stride, stride, base, baseStride, size);

				baseStride >>= 1;

				TValue* it = beg;
				TValue* it2 = it + size * stride;
				const TValue* const itEnd = it2;
				for (; it != itEnd; it += stride, it2 += stride, base += baseStride)
				{
					TValue tmp = *base * *it2;
					*it2 = *it - tmp;
					*it += tmp;
				}
			}
		}